

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::ParseNode_Mesh(AMFImporter *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CAMFImporter_NodeElement *pCVar3;
  char cVar4;
  int iVar5;
  CAMFImporter_NodeElement *pNode;
  _List_node_base *p_Var6;
  undefined8 uVar7;
  char *__end;
  string local_78;
  uint local_54;
  string local_50;
  
  pNode = (CAMFImporter_NodeElement *)operator_new(0x50);
  pCVar3 = this->mNodeElement_Cur;
  pNode->Type = ENET_Mesh;
  (pNode->ID)._M_dataplus._M_p = (pointer)&(pNode->ID).field_2;
  uVar7 = 0;
  (pNode->ID)._M_string_length = 0;
  (pNode->ID).field_2._M_local_buf[0] = '\0';
  pNode->Parent = pCVar3;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pNode->_vptr_CAMFImporter_NodeElement = (_func_int **)&PTR__CAMFImporter_NodeElement_0080e4d8;
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar5 == '\0') {
    ParseHelper_Node_Enter(this,pNode);
    iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    paVar2 = &local_78.field_2;
    if ((char)iVar5 != '\0') {
      local_54 = 0;
      do {
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar5 == 1) {
          local_78._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"vertices","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = std::__cxx11::string::compare((char *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (iVar5 != 0) {
            local_78._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"volume","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != paVar2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if (iVar5 == 0) {
              ParseNode_Volume(this);
            }
            else {
              local_78._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mesh","");
              XML_CheckNode_SkipUnsupported(this,&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != paVar2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
            }
            goto LAB_003dfb01;
          }
          if ((local_54 & 1) != 0) {
            local_78._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"vertices","");
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"Only one vertices set can be defined for <mesh>.","");
            Throw_MoreThanOnceDefined(this,&local_78,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != paVar2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
          }
          ParseNode_Vertices(this);
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          cVar4 = (char)iVar5;
          uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
          local_54 = (uint)uVar7;
        }
        else {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar5 == 2) {
            local_78._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mesh","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != paVar2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if (iVar5 == 0) goto LAB_003dfbfb;
          }
LAB_003dfb01:
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          cVar4 = (char)iVar5;
        }
      } while (cVar4 != '\0');
    }
    local_78._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mesh","");
    Throw_CloseNotFound(this,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
LAB_003dfbfb:
    ParseHelper_Node_Exit(this);
  }
  else {
    pCVar3 = this->mNodeElement_Cur;
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next = (_List_node_base *)pNode;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(pCVar3->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var6 = (_List_node_base *)operator_new(0x18);
  p_Var6[1]._M_next = (_List_node_base *)pNode;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void AMFImporter::ParseNode_Mesh()
{
CAMFImporter_NodeElement* ne;

	// create new mesh object.
	ne = new CAMFImporter_NodeElement_Mesh(mNodeElement_Cur);
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool vert_read = false;

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("mesh");
			if(XML_CheckNode_NameEqual("vertices"))
			{
				// Check if data already defined.
				if(vert_read) Throw_MoreThanOnceDefined("vertices", "Only one vertices set can be defined for <mesh>.");
				// read data and set flag about it
				ParseNode_Vertices();
				vert_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("volume")) { ParseNode_Volume(); continue; }
		MACRO_NODECHECK_LOOPEND("mesh");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}